

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  bool bVar1;
  Index IVar2;
  Offset OVar3;
  Result result;
  reference pvVar4;
  Index defined_index;
  Offset size_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  IVar2 = num_func_imports(this);
  pvVar4 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::operator[]
                     (&this->module_->funcs,(ulong)(index - IVar2));
  this->func_ = pvVar4;
  OVar3 = Istream::end(this->istream_);
  this->func_->code_offset = OVar3;
  FixupMap::Clear(&this->depth_fixups_);
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::clear(&this->label_stack_);
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index - IVar2);
  result = SharedValidator::BeginFunctionBody
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                      index);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,0xffffffff,0xffffffff);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(loc, index));

  // Push implicit func label (equivalent to return).
  PushLabel();
  return Result::Ok;
}